

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O3

bool __thiscall Test::Suite::run(Suite *this,Output *out,bool continueOnError)

{
  int iVar1;
  undefined7 in_register_00000011;
  void *pvVar2;
  void *local_38;
  void *local_30;
  
  (*this->_vptr_Suite[4])(&local_38,this);
  iVar1 = (*this->_vptr_Suite[3])
                    (this,out,&local_38,CONCAT71(in_register_00000011,continueOnError) & 0xffffffff)
  ;
  for (pvVar2 = local_38; pvVar2 != local_30; pvVar2 = (void *)((long)pvVar2 + 0x28)) {
    std::__cxx11::string::~string((string *)((long)pvVar2 + 8));
  }
  if (local_38 != (void *)0x0) {
    operator_delete(local_38);
  }
  return SUB41(iVar1,0);
}

Assistant:

bool Suite::run(Output &out, bool continueOnError) { return run(out, listTests(), continueOnError); }